

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendstate.c
# Opt level: O1

void quicly_sendstate_init_closed(quicly_sendstate_t *state)

{
  quicly_ranges_init_with_range(&state->acked,0,0);
  (state->pending).ranges = &(state->pending)._initial;
  (state->pending).num_ranges = 0;
  (state->pending).capacity = 1;
  state->size_inflight = 0;
  state->final_size = 0xffffffffffffffff;
  ((state->acked).ranges)->end = 1;
  state->final_size = 0;
  return;
}

Assistant:

void quicly_sendstate_init_closed(quicly_sendstate_t *state)
{
    quicly_sendstate_init(state);
    state->acked.ranges[0].end = 1;
    state->final_size = 0;
}